

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O1

void signalfd_in_thread_test(int which)

{
  int iVar1;
  int iVar2;
  pthread_t __threadid;
  ssize_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  int ep;
  epoll_event event_result;
  pthread_t thread;
  epoll_event event;
  signalfd_siginfo fdsi;
  sigset_t mask;
  int local_138;
  undefined1 local_134 [12];
  pthread_t local_128;
  undefined1 local_11c [16];
  undefined4 local_10c;
  sigset_t local_90;
  
  sigemptyset(&local_90);
  sigaddset(&local_90,2);
  iVar1 = sigprocmask(0,&local_90,(sigset_t *)0x0);
  if (iVar1 == 0) {
    iVar1 = signalfd(-1,&local_90,0);
    if (iVar1 < 0) {
      pcVar4 = "sfd >= 0";
      uVar5 = 0x3c8;
    }
    else {
      local_138 = epoll_create1(0x80000);
      if (local_138 < 0) {
        pcVar4 = "ep >= 0";
        uVar5 = 0x3cb;
      }
      else {
        local_11c._0_4_ = 1;
        local_11c._4_4_ = iVar1;
        iVar2 = epoll_ctl(local_138,1,iVar1,(epoll_event *)local_11c);
        if (iVar2 == 0) {
          iVar2 = epoll_wait(local_138,(epoll_event *)local_134,1,0);
          if (iVar2 == 0) {
            __threadid = pthread_self();
            iVar2 = pthread_kill(__threadid,2);
            if (iVar2 == 0) {
              local_11c._12_4_ = local_138;
              local_10c = 1;
              iVar2 = poll((pollfd *)(local_11c + 0xc),1,-1);
              if (iVar2 == 1) {
                if (local_10c._2_2_ == 1) {
                  iVar2 = pthread_create(&local_128,(pthread_attr_t *)0x0,signalfd_thread,&local_138
                                        );
                  if (iVar2 == 0) {
                    iVar2 = pthread_join(local_128,(void **)0x0);
                    if (iVar2 == 0) {
                      if (which == 0) {
                        local_11c._12_4_ = local_138;
                        local_10c = 1;
                        iVar2 = poll((pollfd *)(local_11c + 0xc),1,0);
                        if (iVar2 != 0) {
                          pcVar4 = "poll(&pfd, 1, 0) == 0";
                          uVar5 = 0x3ed;
                          goto LAB_00106aaa;
                        }
                        iVar2 = epoll_wait(local_138,(epoll_event *)local_134,1,0);
                        if (iVar2 != 0) {
                          pcVar4 = "epoll_wait(ep, &event_result, 1, 0) == 0";
                          uVar5 = 0x3ef;
                          goto LAB_00106aaa;
                        }
                        iVar2 = epoll_ctl(local_138,2,iVar1,(epoll_event *)0x0);
                        if (iVar2 != 0) {
                          pcVar4 = "epoll_ctl(ep, EPOLL_CTL_DEL, sfd, NULL) == 0";
                          uVar5 = 0x3f1;
                          goto LAB_00106aaa;
                        }
                        iVar2 = epoll_ctl(local_138,1,iVar1,(epoll_event *)local_11c);
                        if (iVar2 != 0) {
                          pcVar4 = "epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0";
                          uVar5 = 0x3f2;
                          goto LAB_00106aaa;
                        }
                        iVar2 = epoll_wait(local_138,(epoll_event *)local_134,1,-1);
                        if (iVar2 != 1) {
                          pcVar4 = "epoll_wait(ep, &event_result, 1, -1) == 1";
                          uVar5 = 0x3f4;
                          goto LAB_00106aaa;
                        }
                        if (local_134._0_4_ != 1) {
                          pcVar4 = "event_result.events == EPOLLIN";
                          uVar5 = 0x3f5;
                          goto LAB_00106aaa;
                        }
                        if (local_134._4_4_ != iVar1) {
                          pcVar4 = "event_result.data.fd == sfd";
                          uVar5 = 0x3f6;
                          goto LAB_00106aaa;
                        }
                      }
                      else {
                        local_10c = 1;
                        local_11c._12_4_ = iVar1;
                        iVar2 = poll((pollfd *)(local_11c + 0xc),1,-1);
                        if (iVar2 != 1) {
                          pcVar4 = "poll(&pfd, 1, -1) == 1";
                          uVar5 = 0x3e9;
                          goto LAB_00106aaa;
                        }
                        if (local_10c._2_2_ != 1) {
                          pcVar4 = "pfd.revents == POLLIN";
                          uVar5 = 0x3ea;
                          goto LAB_00106aaa;
                        }
                      }
                      sVar3 = read(iVar1,local_11c + 0xc,0x80);
                      if (sVar3 == 0x80) {
                        iVar2 = sigprocmask(1,&local_90,(sigset_t *)0x0);
                        if (iVar2 == 0) {
                          iVar2 = close(local_138);
                          if (iVar2 == 0) {
                            iVar1 = close(iVar1);
                            if (iVar1 == 0) {
                              return;
                            }
                            pcVar4 = "close(sfd) == 0";
                            uVar5 = 0x3ff;
                          }
                          else {
                            pcVar4 = "close(ep) == 0";
                            uVar5 = 0x3fe;
                          }
                        }
                        else {
                          pcVar4 = "sigprocmask(SIG_UNBLOCK, &mask, NULL) == 0";
                          uVar5 = 0x3fc;
                        }
                      }
                      else {
                        pcVar4 = "s == sizeof(struct signalfd_siginfo)";
                        uVar5 = 0x3fa;
                      }
                    }
                    else {
                      pcVar4 = "pthread_join(thread, NULL) == 0";
                      uVar5 = 0x3e5;
                    }
                  }
                  else {
                    pcVar4 = "pthread_create(&thread, NULL, signalfd_thread, &ep) == 0";
                    uVar5 = 0x3e4;
                  }
                }
                else {
                  pcVar4 = "pfd.revents == POLLIN";
                  uVar5 = 0x3e0;
                }
              }
              else {
                pcVar4 = "poll(&pfd, 1, -1) == 1";
                uVar5 = 0x3df;
              }
            }
            else {
              pcVar4 = "pthread_kill(pthread_self(), SIGINT) == 0";
              uVar5 = 0x3d6;
            }
          }
          else {
            pcVar4 = "epoll_wait(ep, &event_result, 1, 0) == 0";
            uVar5 = 0x3d4;
          }
        }
        else {
          pcVar4 = "epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0";
          uVar5 = 0x3d1;
        }
      }
    }
  }
  else {
    pcVar4 = "sigprocmask(SIG_BLOCK, &mask, NULL) == 0";
    uVar5 = 0x3c5;
  }
LAB_00106aaa:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar5,pcVar4);
}

Assistant:

static void
signalfd_in_thread_test(int which)
{
	sigset_t mask;
	struct signalfd_siginfo fdsi;
	ssize_t s;

	sigemptyset(&mask);
	sigaddset(&mask, SIGINT);

	ATF_REQUIRE(sigprocmask(SIG_BLOCK, &mask, NULL) == 0);

	int sfd = signalfd(-1, &mask, 0);
	ATF_REQUIRE(sfd >= 0);

	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.fd = sfd;

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0);

	struct epoll_event event_result;
	ATF_REQUIRE(epoll_wait(ep, &event_result, 1, 0) == 0);

	ATF_REQUIRE(pthread_kill(pthread_self(), SIGINT) == 0);

	{
		struct pollfd pfd = { .fd = ep, .events = POLLIN };
#if defined(__DragonFly__) || defined(__APPLE__)
		ATF_REQUIRE(poll(&pfd, 1, 0) == 0);
		atf_tc_skip("signals sent to threads won't trigger "
			    "EVFILT_SIGNAL on DragonFly/macOS");
#endif
		ATF_REQUIRE(poll(&pfd, 1, -1) == 1);
		ATF_REQUIRE(pfd.revents == POLLIN);
	}

	pthread_t thread;
	ATF_REQUIRE(pthread_create(&thread, NULL, signalfd_thread, &ep) == 0);
	ATF_REQUIRE(pthread_join(thread, NULL) == 0);

	if (which) {
		struct pollfd pfd = { .fd = sfd, .events = POLLIN };
		ATF_REQUIRE(poll(&pfd, 1, -1) == 1);
		ATF_REQUIRE(pfd.revents == POLLIN);
	} else {
		struct pollfd pfd = { .fd = ep, .events = POLLIN };
		ATF_REQUIRE(poll(&pfd, 1, 0) == 0);

		ATF_REQUIRE(epoll_wait(ep, &event_result, 1, 0) == 0);

		ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_DEL, sfd, NULL) == 0);
		ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0);

		ATF_REQUIRE(epoll_wait(ep, &event_result, 1, -1) == 1);
		ATF_REQUIRE(event_result.events == EPOLLIN);
		ATF_REQUIRE(event_result.data.fd == sfd);
	}

	s = read(sfd, &fdsi, sizeof(struct signalfd_siginfo));
	ATF_REQUIRE(s == sizeof(struct signalfd_siginfo));

	ATF_REQUIRE(sigprocmask(SIG_UNBLOCK, &mask, NULL) == 0);

	ATF_REQUIRE(close(ep) == 0);
	ATF_REQUIRE(close(sfd) == 0);
}